

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationkeys.cpp
# Opt level: O3

UBool __thiscall
icu_63::anon_unknown_4::SortKeyLevel::ensureCapacity(SortKeyLevel *this,int32_t appendCapacity)

{
  uint uVar1;
  UBool UVar2;
  uint uVar3;
  uchar *__dest;
  uint uVar4;
  ulong uVar5;
  size_t s;
  
  if (this->ok != '\0') {
    uVar4 = this->len;
    uVar3 = (this->buffer).capacity * 2;
    uVar1 = uVar4 + appendCapacity * 2;
    if ((int)uVar3 <= (int)uVar1) {
      uVar3 = uVar1;
    }
    s = 200;
    if (200 < (int)uVar3) {
      s = (size_t)uVar3;
    }
    __dest = (uchar *)uprv_malloc_63(s);
    if (__dest == (uchar *)0x0) {
      this->ok = '\0';
      UVar2 = '\0';
    }
    else {
      if (0 < (int)uVar4) {
        uVar1 = (this->buffer).capacity;
        if ((int)uVar1 < (int)uVar4) {
          uVar4 = uVar1;
        }
        uVar5 = (ulong)uVar4;
        if ((int)s <= (int)uVar4) {
          uVar5 = s;
        }
        memcpy(__dest,(this->buffer).ptr,(long)(int)uVar5);
      }
      if ((this->buffer).needToRelease != '\0') {
        uprv_free_63((this->buffer).ptr);
      }
      (this->buffer).ptr = __dest;
      (this->buffer).capacity = (int)s;
      (this->buffer).needToRelease = '\x01';
      UVar2 = '\x01';
    }
    return UVar2;
  }
  return '\0';
}

Assistant:

UBool SortKeyLevel::ensureCapacity(int32_t appendCapacity) {
    if(!ok) {
        return FALSE;
    }
    int32_t newCapacity = 2 * buffer.getCapacity();
    int32_t altCapacity = len + 2 * appendCapacity;
    if (newCapacity < altCapacity) {
        newCapacity = altCapacity;
    }
    if (newCapacity < 200) {
        newCapacity = 200;
    }
    if(buffer.resize(newCapacity, len)==NULL) {
        return ok = FALSE;
    }
    return TRUE;
}